

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  TestResult *in_RSI;
  ostream *in_RDI;
  allocator<char> *in_stack_fffffffffffffb60;
  ostream *__a;
  char *in_stack_fffffffffffffb68;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_stack_fffffffffffffc08;
  string *value;
  string *name;
  string *element_name;
  ostream *stream_00;
  string local_3d0 [39];
  allocator<char> local_3a9;
  string local_3a8 [39];
  allocator<char> local_381;
  string local_380 [32];
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [32];
  TimeInMillis in_stack_fffffffffffffce8;
  string local_310 [39];
  undefined1 local_2e9 [40];
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [32];
  TimeInMillis in_stack_fffffffffffffdd8;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [16];
  TestResult *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  undefined1 local_b9 [40];
  undefined1 local_91 [40];
  undefined1 local_69 [56];
  allocator<char> local_31;
  string local_30 [32];
  TestResult *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RDI,"  <testsuite");
  stream_00 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  element_name = (string *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  name = (string *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  OutputXmlAttribute(stream_00,element_name,name,in_stack_fffffffffffffc08);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  value = (string *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffddf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string((string *)(local_2e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  __s = &stack0xfffffffffffffcef;
  __a = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,(allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,(allocator<char> *)__a);
  TestResult::elapsed_time(local_10);
  FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffce8);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,(allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,(allocator<char> *)__a);
  TestResult::start_timestamp(local_10);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(in_stack_fffffffffffffdd8);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator(&local_381);
  std::operator<<(local_8,">");
  OutputXmlTestCaseForTestResult(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::operator<<(local_8,"  </testsuite>\n");
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a minimal test suite with one test.
  *stream << "  <testsuite";
  OutputXmlAttribute(stream, "testsuite", "name", "NonTestSuiteFailure");
  OutputXmlAttribute(stream, "testsuite", "tests", "1");
  OutputXmlAttribute(stream, "testsuite", "failures", "1");
  OutputXmlAttribute(stream, "testsuite", "disabled", "0");
  OutputXmlAttribute(stream, "testsuite", "skipped", "0");
  OutputXmlAttribute(stream, "testsuite", "errors", "0");
  OutputXmlAttribute(stream, "testsuite", "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, "testsuite", "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  *stream << ">";

  OutputXmlTestCaseForTestResult(stream, result);

  // Complete the test suite.
  *stream << "  </testsuite>\n";
}